

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_m(source origin,wchar_t r,loc_conflict grid,wchar_t dam,wchar_t typ,wchar_t flg,
              _Bool *did_hit,_Bool *was_obvious)

{
  byte *pbVar1;
  int16_t *piVar2;
  short sVar3;
  project_monster_handler_f p_Var4;
  monster_group_info group_info;
  loc lVar5;
  mon_messages mVar6;
  _Bool _Var7;
  _Bool _Var8;
  byte bVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  square *psVar12;
  monster_conflict *pmVar13;
  monster *pmVar14;
  monster_race *race;
  monster_race *pmVar15;
  wchar_t i;
  long lVar16;
  undefined1 uVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  anon_enum_32 aVar20;
  uint32_t m;
  char *fmt;
  wchar_t wVar21;
  char cVar22;
  int iVar23;
  wchar_t wVar24;
  source origin_00;
  wchar_t local_110;
  project_monster_handler_context_t local_108;
  loc local_90;
  char m_name [80];
  
  aVar20 = origin.what;
  local_90.x._0_1_ = aVar20 == SRC_PLAYER && (flg & 0x100U) == 0;
  if (aVar20 == SRC_PLAYER) {
    _Var7 = flag_has_dbg((player->state).pflags,10,0x1e,"player->state.pflags","(PF_CHARM)");
    local_108.beguile =
         flag_has_dbg((player->state).pflags,10,0x41,"player->state.pflags","(PF_BEGUILE)");
  }
  else {
    _Var7 = false;
    local_108.beguile = false;
  }
  psVar12 = square(cave,(loc)grid);
  sVar3 = psVar12->mon;
  local_108.seen = false;
  local_108.id = (_Bool)(undefined1)local_90.x;
  local_108.mon = (monster *)0x0;
  local_108.lore = (monster_lore *)0x0;
  local_108.obvious = SUB41((uint)(flg & 0x100U) >> 8,0);
  p_Var4 = monster_handlers[typ];
  local_108.skipped = false;
  local_108.flag = 0;
  local_108.do_poly = L'\0';
  local_108.teleport_distance = L'\0';
  local_108.hurt_msg = MON_MSG_NONE;
  local_108.die_msg = MON_MSG_DIE;
  local_108.mon_timed[0] = L'\0';
  local_108.mon_timed[1] = L'\0';
  local_108.mon_timed[2] = L'\0';
  local_108.mon_timed[3] = L'\0';
  local_108.mon_timed[4] = L'\0';
  local_108.mon_timed[5] = L'\0';
  local_108.mon_timed[6] = L'\0';
  local_108.mon_timed[7] = L'\0';
  local_108.mon_timed[8] = L'\0';
  local_108.mon_timed[9] = L'\0';
  *did_hit = false;
  *was_obvious = false;
  local_108.origin.what = aVar20;
  local_108.origin.which = origin.which;
  local_108.r = r;
  local_108.grid = (loc)grid;
  local_108.dam = dam;
  local_108.type = typ;
  local_108.charm = _Var7;
  _Var7 = square_ispassable(cave,(loc)grid);
  if (sVar3 < 1 || !_Var7) {
    return;
  }
  wVar21 = (wchar_t)sVar3;
  local_110 = origin.which._0_4_;
  if ((aVar20 == SRC_MONSTER) && (local_110 == wVar21)) {
    return;
  }
  pmVar13 = (monster_conflict *)cave_monster(cave,wVar21);
  local_108.lore = get_lore(pmVar13->race);
  local_108.mon = (monster *)pmVar13;
  _Var7 = monster_is_camouflaged((monster *)pmVar13);
  if (_Var7) {
    _Var7 = monster_is_in_view((monster *)pmVar13);
  }
  else {
    _Var7 = monster_is_visible((monster *)pmVar13);
  }
  if (_Var7 != false) {
    local_108.seen = true;
  }
  if (((uint)flg >> 9 & 1) != 0 && aVar20 == SRC_MONSTER) {
    pmVar14 = cave_monster(cave,local_110);
    if (pmVar14 == (monster *)0x0) {
      return;
    }
    if (pmVar14->race == pmVar13->race) {
      return;
    }
  }
  _Var7 = square_isprotect(cave,(loc)grid);
  if ((((_Var7) && (uVar10 = Rand_div(4), uVar10 == 0)) &&
      (_Var7 = flag_has_dbg(pmVar13->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE"),
      !_Var7)) && (pmVar13->m_timed[0] == 0)) {
    monster_desc(m_name,0x50,(monster *)pmVar13,L'̔');
    _Var7 = square_isrubble(cave,(loc)grid);
    if (_Var7) {
      fmt = "%s ducks behind a boulder!";
LAB_001c541f:
      msg(fmt,m_name);
      return;
    }
    _Var7 = square_istree(cave,(loc)grid);
    if (_Var7) {
      fmt = "%s hides behind a tree!";
      goto LAB_001c541f;
    }
  }
  _Var7 = monster_is_destroyed((monster *)pmVar13);
  if (_Var7) {
    local_108.die_msg = MON_MSG_DESTROYED;
  }
  if ((((flg & 8U) != 0) && (_Var7 = monster_is_camouflaged((monster *)pmVar13), _Var7)) &&
     (_Var7 = monster_is_in_view((monster *)pmVar13), _Var7)) {
    become_aware((chunk *)cave,pmVar13);
    _Var7 = monster_is_visible((monster *)pmVar13);
    if (_Var7) {
      local_108.seen = true;
    }
  }
  if ((projections[typ].obvious == true) && (local_108.seen == true)) {
    local_108.obvious = true;
  }
  local_108.dam =
       terrain_adjust_dam((player *)0x0,(monster_conflict *)local_108.mon,typ,local_108.dam);
  if (typ != L'>') {
    (*p_Var4)(&local_108);
  }
  if (projections[typ].wake == true) {
    monster_wake(pmVar13,false,L'd');
  }
  pmVar14 = local_108.mon;
  _Var7 = local_108.seen;
  wVar11 = local_108.dam;
  if (local_108.skipped != false) {
    return;
  }
  wVar19 = local_108.hurt_msg;
  mVar6 = local_108.die_msg;
  if (aVar20 == SRC_MONSTER) {
    _Var8 = monster_is_unique(local_108.mon);
    if ((_Var8) && (pmVar14->hp <= wVar11)) {
      wVar11 = (int)pmVar14->hp;
    }
    if ((monster_conflict *)player->upkeep->health_who == (monster_conflict *)pmVar14) {
      pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    monster_wake((monster_conflict *)pmVar14,false,L'\0');
    piVar2 = &pmVar14->hp;
    *piVar2 = *piVar2 - (short)wVar11;
    if (-1 < *piVar2) {
      _Var8 = monster_is_camouflaged(pmVar14);
      if (!_Var8) {
        if ((wVar19 != L'\0' & _Var7) == 1) {
          _Var7 = false;
          goto LAB_001c5048;
        }
        if (L'\0' < wVar11) {
          message_pain((monster_conflict *)pmVar14,wVar11);
        }
      }
      goto LAB_001c505f;
    }
    wVar11 = L'.';
    if (_Var7 != false) {
      wVar11 = mVar6;
    }
    add_monster_message((monster_conflict *)pmVar14,wVar11,false);
    monster_death((monster_conflict *)pmVar14,player,false);
    delete_monster_idx((chunk *)cave,wVar21);
    pmVar13 = (monster_conflict *)local_108.mon;
    uVar17 = local_108.obvious;
joined_r0x001c4fb5:
    local_108.mon = (monster *)pmVar13;
    local_108.obvious = (_Bool)uVar17;
    if (pmVar13 == (monster_conflict *)0x0) goto LAB_001c53dc;
  }
  else {
    m_name._0_8_ = m_name._0_8_ & 0xffffffffffffff00;
    if (local_108.origin.what == SRC_PLAYER) {
      cVar22 = (player->opts).opt[3];
      if ((local_108.mon)->hp < local_108.dam) {
        wVar18 = L'.';
        if (local_108.seen != false) {
          wVar18 = local_108.die_msg;
        }
        if ((_Bool)cVar22 == false) goto LAB_001c4f13;
        add_monster_message_show_damage
                  ((monster_conflict *)local_108.mon,wVar18,false,local_108.dam);
        cVar22 = '\x01';
      }
    }
    else if ((local_108.mon)->hp < local_108.dam) {
      wVar18 = L'.';
      if (local_108.seen != false) {
        wVar18 = local_108.die_msg;
      }
LAB_001c4f13:
      cVar22 = '\0';
      add_monster_message((monster_conflict *)local_108.mon,wVar18,false);
    }
    else {
      cVar22 = '\0';
    }
    if ((wVar11 != L'\0') &&
       (_Var8 = mon_take_hit((monster_conflict *)pmVar14,player,wVar11,(_Bool *)m_name,""),
       pmVar13 = (monster_conflict *)local_108.mon, uVar17 = local_108.obvious, _Var8))
    goto joined_r0x001c4fb5;
    bVar9 = wVar19 != L'\0' & _Var7;
    if (cVar22 == '\0') {
      if (bVar9 == 0) {
        if (L'\0' < wVar11) {
          message_pain((monster_conflict *)pmVar14,wVar11);
        }
      }
      else {
        add_monster_message((monster_conflict *)pmVar14,wVar19,false);
      }
    }
    else if (bVar9 == 0) {
      if (L'\0' < wVar11) {
        message_pain_show_damage((monster_conflict *)pmVar14,wVar11);
      }
    }
    else {
      add_monster_message_show_damage((monster_conflict *)pmVar14,wVar19,false,wVar11);
    }
    if ((_Var7 != false) && (m_name[0] == '\x01')) {
      wVar19 = L'%';
      _Var7 = true;
LAB_001c5048:
      add_monster_message((monster_conflict *)pmVar14,wVar19,_Var7);
    }
LAB_001c505f:
    pmVar13 = (monster_conflict *)local_108.mon;
    wVar11 = local_108.type;
    lVar5 = local_108.grid;
    if (local_108.do_poly == L'\0') {
      if (local_108.teleport_distance < L'\x01') {
        lVar16 = 0;
        do {
          if ((L'\0' < local_108.mon_timed[lVar16]) &&
             (mon_inc_timed((monster *)pmVar13,(wchar_t)lVar16,local_108.mon_timed[lVar16],
                            local_108.flag | 1), local_108.seen == true)) {
            local_108.obvious = true;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 10);
      }
      else {
        strnfmt(m_name,5,"%d");
        origin_00._4_4_ = 0;
        origin_00.what = local_108.origin.what;
        origin_00.which.trap = local_108.origin.which.trap;
        effect_simple(L';',origin_00,m_name,L'\0',L'\0',L'\0',local_108.grid.y,local_108.grid.x,
                      (_Bool *)0x0);
        monster_wake(pmVar13,false,L'\0');
      }
    }
    else {
      _Var7 = monster_is_unique(local_108.mon);
      if ((_Var7) || (player->upkeep->arena_level == true)) {
joined_r0x001c537d:
        if (local_108.seen != true) goto LAB_001c5383;
        wVar21 = L'\b';
      }
      else {
        if (local_108.seen == true) {
          local_108.obvious = true;
        }
        uVar10 = 1;
        if (L'\v' < local_108.do_poly) {
          uVar10 = local_108.do_poly + L'\xfffffff6';
        }
        m = 0x5a;
        if (wVar11 == L'4') {
          m = uVar10;
        }
        uVar10 = Rand_div(m);
        wVar19 = uVar10 + L'\x01';
        if (wVar11 == L'4') {
          wVar19 = uVar10 + L'\v';
        }
        if (((monster *)pmVar13)->race->level <= wVar19) {
          local_90 = lVar5;
          pmVar15 = ((monster *)pmVar13)->race;
          if (((monster *)pmVar13)->original_race != (monster_race *)0x0) {
            pmVar15 = ((monster *)pmVar13)->original_race;
          }
          if ((pmVar15 == (monster_race *)0x0) || (pmVar15->name == (char *)0x0)) {
            __assert_fail("race && race->name",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/project-mon.c"
                          ,0x32,"struct monster_race *poly_race(struct monster_race *, int)");
          }
          wVar11 = (wchar_t)player->depth;
          _Var7 = flag_has_dbg(pmVar15->flags,0xc,1,"race->flags","RF_UNIQUE");
          if (!_Var7) {
            wVar19 = pmVar15->level;
            iVar23 = wVar19 * 3 + 3;
            if (-1 < wVar19 * 3) {
              iVar23 = wVar19 * 3;
            }
            wVar18 = iVar23 >> 2;
            if (wVar19 + L'\xfffffff6' < iVar23 >> 2) {
              wVar18 = wVar19 + L'\xfffffff6';
            }
            iVar23 = wVar19 * 5 + 3;
            if (-1 < wVar19 * 5) {
              iVar23 = wVar19 * 5;
            }
            wVar24 = iVar23 >> 2;
            if (iVar23 >> 2 < wVar19 + L'\n') {
              wVar24 = wVar19 + L'\n';
            }
            uVar10 = Rand_div(100);
            if (uVar10 == 0) {
              wVar24 = L'd';
            }
            iVar23 = 1000;
            do {
              race = get_mon_num((wVar11 + wVar19) / 2 + L'\x05',wVar11);
              if ((race != (monster_race *)0x0) && (race != pmVar15)) {
                _Var7 = flag_has_dbg(race->flags,0xc,1,"new_race->flags","RF_UNIQUE");
                if (((!_Var7) && ((wVar18 <= race->level && (race->level <= wVar24)))) &&
                   ((_Var7 = flag_has_dbg(race->flags,0xc,0xc,"new_race->flags","RF_FORCE_DEPTH"),
                    !_Var7 || (race->level <= wVar11)))) {
                  m_name[0] = '\0';
                  m_name[1] = '\0';
                  m_name[2] = '\0';
                  m_name[3] = '\0';
                  m_name[4] = '\0';
                  m_name[5] = '\0';
                  m_name[6] = '\0';
                  m_name[7] = '\0';
                  m_name[8] = '\0';
                  m_name[9] = '\0';
                  m_name[10] = '\0';
                  m_name[0xb] = '\0';
                  m_name[0xc] = '\0';
                  m_name[0xd] = '\0';
                  m_name[0xe] = '\0';
                  m_name[0xf] = '\0';
                  if (local_108.seen == true) {
                    add_monster_message(pmVar13,L'\x16',false);
                  }
                  delete_monster_idx((chunk *)cave,wVar21);
                  lVar5 = local_90;
                  group_info.player_race = (player_race *)m_name._8_8_;
                  group_info._0_8_ = m_name._0_8_;
                  place_new_monster((chunk *)cave,local_90,race,false,false,group_info,'\x17');
                  local_108.mon = square_monster(cave,lVar5);
                  if (((monster_conflict *)local_108.mon == (monster_conflict *)0x0 ||
                       local_108.seen != false) ||
                     (_Var7 = monster_is_visible(local_108.mon), !_Var7)) goto LAB_001c5383;
                  pmVar13 = (monster_conflict *)local_108.mon;
                  wVar21 = L'6';
                  goto LAB_001c50ae;
                }
              }
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
          }
          goto joined_r0x001c537d;
        }
        if (local_108.seen != true) goto LAB_001c5383;
        wVar21 = L'\b';
        if (wVar11 == L'4') {
          wVar21 = L'3';
        }
      }
LAB_001c50ae:
      add_monster_message(pmVar13,wVar21,false);
    }
LAB_001c5383:
    uVar17 = local_108.obvious;
    pmVar13 = (monster_conflict *)local_108.mon;
    if ((monster_conflict *)local_108.mon == (monster_conflict *)0x0) goto LAB_001c53dc;
    update_mon((monster_conflict *)local_108.mon,(chunk *)cave,false);
    if (aVar20 == SRC_PLAYER) {
      ((target *)&((monster *)pmVar13)->target)->midx = L'\xffffffff';
    }
  }
  square_light_spot((chunk *)cave,pmVar13->grid);
  if (player->upkeep->monster_race == pmVar13->race) {
    pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
LAB_001c53dc:
  *did_hit = true;
  *was_obvious = (_Bool)uVar17;
  return;
}

Assistant:

void project_m(struct source origin, int r, struct loc grid, int dam, int typ,
			   int flg, bool *did_hit, bool *was_obvious)
{
	struct monster *mon;
	struct monster_lore *lore;

	/* Is the monster "seen"? */
	bool seen = false;
	bool mon_died = false;

	/* Is the effect obvious? */
	bool obvious = (flg & PROJECT_AWARE ? true : false);

	/* Are we trying to id the source of this effect? */
	bool id = (origin.what == SRC_PLAYER) ? !obvious : false;

	/* Is the source an extra charming player? */
	bool charm = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_CHARM) : false;

	/* Is the source an extra beguiling player? */
	bool beguile = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_BEGUILE) : false;

	int m_idx = square(cave, grid)->mon;

	project_monster_handler_f monster_handler = monster_handlers[typ];
	project_monster_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		seen,
		id,
		NULL, /* mon */
		NULL, /* lore */
		charm,
		beguile,
		obvious,
		false, /* skipped */
		0, /* flag */
		0, /* do_poly */
		0, /* teleport_distance */
		MON_MSG_NONE, /* hurt_msg */
		MON_MSG_DIE, /* die_msg */
		{0, 0, 0, 0, 0, 0},
	};

	*did_hit = false;
	*was_obvious = false;

	/* Walls protect monsters */
	if (!square_ispassable(cave, grid)) return;

	/* No monster here */
	if (!(m_idx > 0)) return;

	/* Never affect projector */
	if (origin.what == SRC_MONSTER && origin.which.monster == m_idx) return;

	/* Obtain monster info */
	mon = cave_monster(cave, m_idx);
	lore = get_lore(mon->race);
	context.mon = mon;
	context.lore = lore;

	/* See visible monsters */
	if (monster_is_camouflaged(mon)) {
		if (monster_is_in_view(mon)) {
			seen = true;
			context.seen = true;
		}
	} else if (monster_is_visible(mon)) {
		seen = true;
		context.seen = seen;
	}

	/* Breathers may not blast members of the same race. */
	if (origin.what == SRC_MONSTER && (flg & PROJECT_SAFE)) {
		/* Point to monster information of caster */
		struct monster *caster = cave_monster(cave, origin.which.monster);
		if (!caster) return;

		/* Skip monsters with the same race */
		if (caster->race == mon->race)
			return;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		if (one_in_(4) && !rf_has(mon->race->flags, RF_NEVER_MOVE) &&
			!mon->m_timed[MON_TMD_SLEEP]) {
			char m_name[80];

			/* Get the monster name (or "it") */
			monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

			/* Monsters can duck behind rubble */
			if (square_isrubble(cave, grid)) {
				msg("%s ducks behind a boulder!", m_name);
				return;
			}

			if (square_istree(cave, grid)) {
				msg("%s hides behind a tree!", m_name);
				return;
			}
		}
	}

	/* Some monsters get "destroyed" */
	if (monster_is_destroyed(mon))
		context.die_msg = MON_MSG_DESTROYED;

	/* Reveal a camouflaged monster if in view and it stopped an effect. */
	if ((flg & PROJECT_STOP) && monster_is_camouflaged(mon)
			&& monster_is_in_view(mon)) {
		become_aware(cave, mon);
		/* Reevaluate whether it's seen. */
		if (monster_is_visible(mon)) {
			seen = true;
			context.seen = true;
		}
	}

	/* Force obviousness for certain types if seen. */
	if (projections[typ].obvious && context.seen)
		context.obvious = true;

	/* Adjust damage for terrain */
	context.dam = terrain_adjust_dam(NULL, context.mon, typ, context.dam);

	if (monster_handler != NULL)
		monster_handler(&context);

	/* Wake monster if required */
	if (projections[typ].wake)
		monster_wake(mon, false, 100);

	/* Absolutely no effect */
	if (context.skipped) return;

	/* Apply damage to the monster, based on who did the damage. */
	if (origin.what == SRC_MONSTER) {
		mon_died = project_m_monster_attack(&context, m_idx);
	} else {
		mon_died = project_m_player_attack(&context);
	}

	if (!mon_died) {
		project_m_apply_side_effects(&context, m_idx);
	}

	/* Update locals, since the project_m_* functions can change some values. */
	mon = context.mon;
	obvious = context.obvious;

	/* Check for NULL, since polymorph can occasionally return NULL. */
	if (mon != NULL) {
		/* Update the monster */
		if (!mon_died) {
			update_mon(mon, cave, false);

			/* Become hostile (to the player only, for now) */
			if (origin.what == SRC_PLAYER) {
				mon->target.midx = -1;
			}
		}

		/* Redraw the (possibly new) monster grid */
		square_light_spot(cave, mon->grid);

		/* Update monster recall window */
		if (player->upkeep->monster_race == mon->race) {
			/* Window stuff */
			player->upkeep->redraw |= (PR_MONSTER);
		}
	}

	/* Track it */
	*did_hit = true;

	/* Return "Anything seen?" */
	*was_obvious = !!obvious;
}